

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNFetc.cpp
# Opt level: O3

void __thiscall NaPNFetcher::action(NaPNFetcher *this)

{
  double dVar1;
  undefined8 uVar2;
  int iVar3;
  NaVector *pNVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar5;
  long lVar6;
  double local_30;
  
  if (this->pfSumWeights == (NaReal *)0x0) {
    if (0 < this->nOutDim) {
      uVar5 = 0;
      do {
        pNVar4 = NaPetriCnInput::data(&this->in);
        iVar3 = (*pNVar4->_vptr_NaVector[8])(pNVar4,(ulong)this->piOutMap[uVar5]);
        uVar2 = *(undefined8 *)CONCAT44(extraout_var_00,iVar3);
        pNVar4 = NaPetriCnOutput::data(&this->out);
        iVar3 = (*pNVar4->_vptr_NaVector[8])(pNVar4,uVar5 & 0xffffffff);
        *(undefined8 *)CONCAT44(extraout_var_01,iVar3) = uVar2;
        uVar5 = uVar5 + 1;
      } while ((long)uVar5 < (long)this->nOutDim);
    }
  }
  else {
    if (this->nOutDim < 1) {
      local_30 = 0.0;
    }
    else {
      local_30 = 0.0;
      lVar6 = 0;
      do {
        dVar1 = this->pfSumWeights[lVar6];
        pNVar4 = NaPetriCnInput::data(&this->in);
        iVar3 = (*pNVar4->_vptr_NaVector[8])(pNVar4,(ulong)this->piOutMap[lVar6]);
        local_30 = local_30 + dVar1 * *(double *)CONCAT44(extraout_var,iVar3);
        lVar6 = lVar6 + 1;
      } while (lVar6 < this->nOutDim);
    }
    pNVar4 = NaPetriCnOutput::data(&this->out);
    iVar3 = (*pNVar4->_vptr_NaVector[8])(pNVar4,0);
    *(double *)CONCAT44(extraout_var_02,iVar3) = local_30;
  }
  return;
}

Assistant:

void
NaPNFetcher::action ()
{
  if(NULL == pfSumWeights)
    {
      int	i;
      for(i = 0; i < nOutDim; ++i){
	out.data()[i] = in.data()[piOutMap[i]];
      }
    }
  else
    {
      NaReal	fSum = 0.0;
      int	i;
      for(i = 0; i < nOutDim; ++i){
	fSum += pfSumWeights[i] * in.data()[piOutMap[i]];
      }
      out.data()[0] = fSum;
    }
}